

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

void __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::performPass(QualifiedIdentifierResolver *this)

{
  RecursiveVariableInitialiserCheck local_28;
  
  ErrorIgnoringRewritingASTVisitor::performPass((ErrorIgnoringRewritingASTVisitor *)this);
  if (this->numVariablesResolved != 0) {
    local_28.super_ASTVisitor._vptr_ASTVisitor =
         (_func_int **)&PTR__RecursiveVariableInitialiserCheck_003305c0;
    local_28.stack.
    super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.stack.
    super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28.stack.
    super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ASTVisitor::visitObject
              (&local_28.super_ASTVisitor,
               (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.module);
    performPass::RecursiveVariableInitialiserCheck::~RecursiveVariableInitialiserCheck(&local_28);
  }
  return;
}

Assistant:

void performPass()
        {
            super::performPass();

            if (numVariablesResolved > 0)
            {
                struct RecursiveVariableInitialiserCheck  : public ASTVisitor
                {
                    void visit (AST::VariableDeclaration& v) override
                    {
                        if (contains (stack, pool_ptr<AST::VariableDeclaration> (v)))
                            v.context.throwError (Errors::initialiserRefersToTarget (v.name));

                        if (v.initialValue != nullptr)
                            stack.push_back (v);

                        ASTVisitor::visit (v);

                        if (v.initialValue != nullptr)
                            stack.pop_back();
                    }

                    void visit (AST::VariableRef& vr) override
                    {
                        visit (vr.variable);
                    }

                    std::vector<pool_ref<AST::VariableDeclaration>> stack;
                };

                RecursiveVariableInitialiserCheck().visitObject (module);
            }
        }